

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum.cpp
# Opt level: O2

void __thiscall Timidity::ToneBank::~ToneBank(ToneBank *this)

{
  ToneBankElement *pTVar1;
  Instrument *this_00;
  int i;
  long lVar2;
  long lVar3;
  
  pTVar1 = this->tone;
  if (pTVar1 != (ToneBankElement *)0x0) {
    lVar2._0_4_ = pTVar1[-1].fontnote;
    lVar2._4_1_ = pTVar1[-1].strip_loop;
    lVar2._5_1_ = pTVar1[-1].strip_envelope;
    lVar2._6_1_ = pTVar1[-1].strip_tail;
    lVar2._7_1_ = pTVar1[-1].field_0x1f;
    if (lVar2 != 0) {
      lVar3 = lVar2 << 5;
      do {
        FString::~FString((FString *)((long)&pTVar1[-1].name.Chars + lVar3));
        lVar3 = lVar3 + -0x20;
      } while (lVar3 != 0);
    }
    operator_delete__(&pTVar1[-1].fontnote,lVar2 << 5 | 8);
  }
  for (lVar2 = 0; lVar2 != 0x80; lVar2 = lVar2 + 1) {
    this_00 = this->instrument[lVar2];
    if ((undefined1 *)0x1 < (undefined1 *)((long)&this_00->samples + 1U)) {
      Instrument::~Instrument(this_00);
      operator_delete(this_00,0x10);
      this->instrument[lVar2] = (Instrument *)0x0;
    }
  }
  return;
}

Assistant:

ToneBank::~ToneBank()
{
	delete[] tone;
	for (int i = 0; i < MAXPROG; i++)
	{
		if (instrument[i] != NULL && instrument[i] != MAGIC_LOAD_INSTRUMENT)
		{
			delete instrument[i];
			instrument[i] = NULL;
		}
	}
}